

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter_p.h
# Opt level: O2

void __thiscall QCompleterPrivate::~QCompleterPrivate(QCompleterPrivate *this)

{
  *(undefined ***)this = &PTR__QCompleterPrivate_007ef578;
  if (this->popup != (QAbstractItemView *)0x0) {
    (**(code **)(*(long *)&(this->popup->super_QAbstractScrollArea).super_QFrame.super_QWidget +
                0x20))();
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->prefix).d);
  QWeakPointer<QObject>::~QWeakPointer(&(this->widget).wp);
  QObjectPrivate::~QObjectPrivate(&this->super_QObjectPrivate);
  return;
}

Assistant:

~QCompleterPrivate() { delete popup; }